

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

double GetDifficulty(CBlockIndex *blockindex)

{
  int iVar1;
  uint uVar2;
  long in_FS_OFFSET;
  double dVar3;
  
  uVar2 = blockindex->nBits;
  dVar3 = 65535.0 / (double)(uVar2 & 0xffffff);
  if (uVar2 < 0x1d000000) {
    iVar1 = (uVar2 >> 0x18) - 0x1d;
    do {
      dVar3 = dVar3 * 256.0;
      iVar1 = iVar1 + 1;
    } while (iVar1 != 0);
  }
  else if (0x1dffffff < uVar2) {
    uVar2 = (uVar2 >> 0x18) + 1;
    do {
      dVar3 = dVar3 * 0.00390625;
      uVar2 = uVar2 - 1;
    } while (0x1e < uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return dVar3;
}

Assistant:

double GetDifficulty(const CBlockIndex& blockindex)
{
    int nShift = (blockindex.nBits >> 24) & 0xff;
    double dDiff =
        (double)0x0000ffff / (double)(blockindex.nBits & 0x00ffffff);

    while (nShift < 29)
    {
        dDiff *= 256.0;
        nShift++;
    }
    while (nShift > 29)
    {
        dDiff /= 256.0;
        nShift--;
    }

    return dDiff;
}